

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O2

spki_record * create_record(int ASN,int ski_offset,int spki_offset,rtr_socket *socket)

{
  long lVar1;
  spki_record *psVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = (spki_record *)calloc(1,0x80);
  psVar2->asn = ASN;
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    *(int *)(psVar2->ski + lVar3 * 4) = ski_offset + (int)lVar3;
  }
  for (lVar3 = 0; lVar3 != 0x16; lVar3 = lVar3 + 1) {
    *(int *)(psVar2->spki + lVar3 * 4) = spki_offset + (int)lVar3;
  }
  psVar2->socket = socket;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psVar2;
  }
  __stack_chk_fail();
}

Assistant:

static struct spki_record *create_record(int ASN, int ski_offset, int spki_offset, struct rtr_socket *socket)
{
	struct spki_record *record = malloc(sizeof(struct spki_record));
	uint32_t i;

	memset(record, 0, sizeof(*record));
	record->asn = ASN;

	for (i = 0; i < sizeof(record->ski) / sizeof(uint32_t); i++)
		((uint32_t *)record->ski)[i] = i + ski_offset;

	for (i = 0; i < sizeof(record->spki) / sizeof(uint32_t); i++)
		((uint32_t *)record->spki)[i] = i + spki_offset;

	record->socket = socket;
	return record;
}